

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

Cursor * __thiscall Table::tableStart(Table *this)

{
  uint32_t pageNum;
  Cursor *pCVar1;
  char *node;
  uint32_t *puVar2;
  
  pCVar1 = (Cursor *)operator_new(0x18);
  pCVar1->table = this;
  pageNum = this->rootPageNum;
  pCVar1->pageNum = pageNum;
  pCVar1->cellNum = 0;
  node = Pager::getPage(this->pager,pageNum);
  puVar2 = leaf_node_num_cells(node);
  pCVar1->endOfTable = *puVar2 == 0;
  return pCVar1;
}

Assistant:

Cursor* Table::tableStart() {
	Cursor *c = new Cursor;
	c->table = this;
	c->pageNum = rootPageNum;
	c->cellNum = 0;

	char *node = pager->getPage(rootPageNum);
	uint32_t numCells = *leaf_node_num_cells(node);

	c->endOfTable = (numCells == 0);
	return c;
}